

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::root_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,root_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false> _Var3;
  char *pcVar4;
  byte *pbVar5;
  matcher<json_out_callbacks> *pmVar6;
  undefined **ppuVar7;
  error_code local_38;
  string *local_28;
  
  if (ch->valid_ == false) {
LAB_00130607:
    local_38._M_cat = get_error_category();
    local_38._M_value = 8;
    matcher<json_out_callbacks>::set_error
              (&this->super_matcher<json_out_callbacks>,parser,&local_38);
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)0x0;
    __return_storage_ptr__->second = true;
    return __return_storage_ptr__;
  }
  iVar2 = (this->super_matcher<json_out_callbacks>).state_;
  if (iVar2 == 2) {
    (this->super_matcher<json_out_callbacks>).state_ = 3;
    _Var3._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
         ._M_head_impl;
    *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
    ((_Var3._M_head_impl)->terminal).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9cf0;
    local_38._M_value = local_38._M_value & 0xffffff00;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->terminal;
    __return_storage_ptr__->second = false;
    goto LAB_001305c9;
  }
  if (iVar2 != 3) {
    if (iVar2 != 1) {
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x698);
    }
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x696);
  }
  if (((this->super_matcher<json_out_callbacks>).field_0xc == '\x01') &&
     (pcVar4 = maybe<char,_void>::operator->(ch), *pcVar4 != '\"')) {
    local_38._M_cat = get_error_category();
    local_38._M_value = 5;
    matcher<json_out_callbacks>::set_error
              (&this->super_matcher<json_out_callbacks>,parser,&local_38);
  }
  (this->super_matcher<json_out_callbacks>).state_ = 1;
  pbVar5 = (byte *)maybe<char,_void>::operator->(ch);
  bVar1 = *pbVar5;
  if (bVar1 - 0x30 < 10) {
LAB_00130564:
    matcher<json_out_callbacks>::
    make_terminal_matcher<pstore::json::details::number_matcher<json_out_callbacks>>
              ((matcher<json_out_callbacks> *)&local_38,(parser<json_out_callbacks> *)this);
  }
  else {
    if (bVar1 != 0x22) {
      if (bVar1 == 0x7b) {
        pmVar6 = (matcher<json_out_callbacks> *)operator_new(0x10);
        pmVar6->state_ = 2;
        ppuVar7 = &PTR__matcher_001a9ef0;
      }
      else {
        if (bVar1 != 0x5b) {
          if (bVar1 == 0x66) {
            matcher<json_out_callbacks>::
            make_terminal_matcher<pstore::json::details::token_matcher<json_out_callbacks,pstore::json::details::false_complete>,char_const(&)[6]>
                      ((matcher<json_out_callbacks> *)&local_38,(parser<json_out_callbacks> *)this,
                       (char (*) [6])parser);
          }
          else if (bVar1 == 0x6e) {
            matcher<json_out_callbacks>::
            make_terminal_matcher<pstore::json::details::token_matcher<json_out_callbacks,pstore::json::details::null_complete>,char_const(&)[5]>
                      ((matcher<json_out_callbacks> *)&local_38,(parser<json_out_callbacks> *)this,
                       (char (*) [5])parser);
          }
          else {
            if (bVar1 != 0x74) {
              if (bVar1 != 0x2d) goto LAB_00130607;
              goto LAB_00130564;
            }
            matcher<json_out_callbacks>::
            make_terminal_matcher<pstore::json::details::token_matcher<json_out_callbacks,pstore::json::details::true_complete>,char_const(&)[5]>
                      ((matcher<json_out_callbacks> *)&local_38,(parser<json_out_callbacks> *)this,
                       (char (*) [5])parser);
          }
          goto LAB_00130575;
        }
        pmVar6 = (matcher<json_out_callbacks> *)operator_new(0x10);
        pmVar6->state_ = 2;
        ppuVar7 = &PTR__matcher_001a9eb0;
      }
      pmVar6->_vptr_matcher = (_func_int **)ppuVar7;
      local_38._M_value = CONCAT31(local_38._M_value._1_3_,1);
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
              )0x1;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
      _M_head_impl = pmVar6;
      __return_storage_ptr__->second = false;
      goto LAB_001305c9;
    }
    local_28 = &parser->string_;
    matcher<json_out_callbacks>::
    make_terminal_matcher<pstore::json::details::string_matcher<json_out_callbacks>,std::__cxx11::string*,bool_const&>
              ((matcher<json_out_callbacks> *)&local_38,(parser<json_out_callbacks> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)parser,
               (bool *)&local_28);
  }
LAB_00130575:
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
       = local_38._M_value._0_1_;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)local_38._M_cat;
  __return_storage_ptr__->second = false;
LAB_001305c9:
  local_38._M_cat = (error_category *)0x0;
  std::
  unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            root_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_token);
                    return {nullptr, true};
                }

                switch (this->get_state ()) {
                case start_state:
                    this->set_state (new_token_state);
                    return {this->make_whitespace_matcher (parser), false};

                case new_token_state: {
                    if (object_key_ && *ch != '"') {
                        this->set_error (parser, error_code::expected_string);
                        // Don't return here in order to allow the switch default to produce a
                        // different error code for a bad token.
                    }
                    this->set_state (done_state);
                    switch (*ch) {
                    case '-':
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9':
                        return {this->template make_terminal_matcher<number_matcher<Callbacks>> (
                                    parser),
                                false};
                    case '"':
                        return {this->template make_terminal_matcher<string_matcher<Callbacks>> (
                                    parser, &parser.string_, object_key_),
                                false};
                    case 't':
                        return {
                            this->template make_terminal_matcher<true_token_matcher<Callbacks>> (
                                parser, "true"),
                            false};
                    case 'f':
                        return {
                            this->template make_terminal_matcher<false_token_matcher<Callbacks>> (
                                parser, "false"),
                            false};
                    case 'n':
                        return {
                            this->template make_terminal_matcher<null_token_matcher<Callbacks>> (
                                parser, "null"),
                            false};
                    case '[':
                        return {
                            typename matcher<Callbacks>::pointer (new array_matcher<Callbacks> ()),
                            false};
                    case '{':
                        return {
                            typename matcher<Callbacks>::pointer (new object_matcher<Callbacks> ()),
                            false};
                    default:
                        this->set_error (parser, error_code::expected_token);
                        return {nullptr, true};
                    }
                } break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                PSTORE_ASSERT (false); // unreachable.
                return {nullptr, true};
            }